

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopDfs.c
# Opt level: O0

void Hop_Compose_rec(Hop_Man_t *p,Hop_Obj_t *pObj,Hop_Obj_t *pFunc,Hop_Obj_t *pVar)

{
  int iVar1;
  Hop_Obj_t *pHVar2;
  Hop_Obj_t *p1;
  Hop_Obj_t *local_30;
  Hop_Obj_t *pVar_local;
  Hop_Obj_t *pFunc_local;
  Hop_Obj_t *pObj_local;
  Hop_Man_t *p_local;
  
  iVar1 = Hop_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hopDfs.c"
                  ,0x185,"void Hop_Compose_rec(Hop_Man_t *, Hop_Obj_t *, Hop_Obj_t *, Hop_Obj_t *)")
    ;
  }
  iVar1 = Hop_ObjIsMarkA(pObj);
  if (iVar1 == 0) {
    iVar1 = Hop_ObjIsConst1(pObj);
    if ((iVar1 == 0) && (iVar1 = Hop_ObjIsPi(pObj), iVar1 == 0)) {
      pHVar2 = Hop_ObjFanin0(pObj);
      Hop_Compose_rec(p,pHVar2,pFunc,pVar);
      pHVar2 = Hop_ObjFanin1(pObj);
      Hop_Compose_rec(p,pHVar2,pFunc,pVar);
      pHVar2 = Hop_ObjChild0Copy(pObj);
      p1 = Hop_ObjChild1Copy(pObj);
      pHVar2 = Hop_And(p,pHVar2,p1);
      (pObj->field_0).pData = pHVar2;
      iVar1 = Hop_ObjIsMarkA(pObj);
      if (iVar1 != 0) {
        __assert_fail("!Hop_ObjIsMarkA(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hopDfs.c"
                      ,400,
                      "void Hop_Compose_rec(Hop_Man_t *, Hop_Obj_t *, Hop_Obj_t *, Hop_Obj_t *)");
      }
      Hop_ObjSetMarkA(pObj);
    }
    else {
      local_30 = pObj;
      if (pObj == pVar) {
        local_30 = pFunc;
      }
      (pObj->field_0).pData = local_30;
    }
  }
  return;
}

Assistant:

void Hop_Compose_rec( Hop_Man_t * p, Hop_Obj_t * pObj, Hop_Obj_t * pFunc, Hop_Obj_t * pVar )
{
    assert( !Hop_IsComplement(pObj) );
    if ( Hop_ObjIsMarkA(pObj) )
        return;
    if ( Hop_ObjIsConst1(pObj) || Hop_ObjIsPi(pObj) )
    {
        pObj->pData = pObj == pVar ? pFunc : pObj;
        return;
    }
    Hop_Compose_rec( p, Hop_ObjFanin0(pObj), pFunc, pVar ); 
    Hop_Compose_rec( p, Hop_ObjFanin1(pObj), pFunc, pVar );
    pObj->pData = Hop_And( p, Hop_ObjChild0Copy(pObj), Hop_ObjChild1Copy(pObj) );
    assert( !Hop_ObjIsMarkA(pObj) ); // loop detection
    Hop_ObjSetMarkA( pObj );
}